

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O2

REF_STATUS
ref_iso_triangle_segment
          (REF_DBL *triangle0,REF_DBL *triangle1,REF_DBL *triangle2,REF_DBL *segment0,
          REF_DBL *segment1,REF_DBL *tuvw)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  REF_STATUS RVar3;
  REF_DBL RVar4;
  REF_DBL RVar5;
  REF_DBL RVar6;
  REF_DBL RVar7;
  REF_DBL RVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  tuvw[2] = 0.0;
  tuvw[3] = 0.0;
  *tuvw = 0.0;
  tuvw[1] = 0.0;
  RVar4 = ref_iso_volume(triangle0,triangle1,triangle2,segment0);
  RVar5 = ref_iso_volume(triangle0,triangle1,triangle2,segment1);
  RVar6 = ref_iso_volume(triangle0,triangle1,segment0,segment1);
  RVar7 = ref_iso_volume(triangle1,triangle2,segment0,segment1);
  RVar8 = ref_iso_volume(triangle2,triangle0,segment0,segment1);
  auVar11._0_8_ = (RVar4 - RVar5) * 1e+20;
  auVar11._8_8_ = RVar4;
  auVar12._8_8_ = -RVar4;
  auVar12._0_8_ = -auVar11._0_8_;
  auVar12 = maxpd(auVar11,auVar12);
  RVar3 = 4;
  if (auVar12._8_8_ < auVar12._0_8_) {
    *tuvw = RVar4 / (RVar4 - RVar5);
    dVar9 = RVar7 + RVar8 + RVar6;
    auVar13._0_8_ = dVar9 * 1e+20;
    auVar13._8_8_ = RVar7;
    auVar2._8_8_ = -RVar7;
    auVar2._0_8_ = -auVar13._0_8_;
    auVar12 = maxpd(auVar13,auVar2);
    dVar10 = auVar12._0_8_;
    if (auVar12._8_8_ < dVar10) {
      RVar4 = RVar8;
      if (RVar8 <= -RVar8) {
        RVar4 = -RVar8;
      }
      if (RVar4 < dVar10) {
        RVar4 = RVar6;
        if (RVar6 <= -RVar6) {
          RVar4 = -RVar6;
        }
        if (RVar4 < dVar10) {
          auVar14._8_8_ = RVar8;
          auVar14._0_8_ = RVar7;
          auVar1._8_8_ = dVar9;
          auVar1._0_8_ = dVar9;
          auVar12 = divpd(auVar14,auVar1);
          *(undefined1 (*) [16])(tuvw + 1) = auVar12;
          tuvw[3] = RVar6 / dVar9;
          RVar3 = 0;
        }
      }
    }
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_iso_triangle_segment(REF_DBL *triangle0,
                                            REF_DBL *triangle1,
                                            REF_DBL *triangle2,
                                            REF_DBL *segment0,
                                            REF_DBL *segment1, REF_DBL *tuvw) {
  double top_volume, bot_volume;
  double side0_volume, side1_volume, side2_volume;
  double total_volume;

  tuvw[0] = 0.0;
  tuvw[1] = 0.0;
  tuvw[2] = 0.0;
  tuvw[3] = 0.0;

  /* is segment in triangle plane? */
  top_volume = ref_iso_volume(triangle0, triangle1, triangle2, segment0);
  bot_volume = ref_iso_volume(triangle0, triangle1, triangle2, segment1);

  /* does segment pass through triangle? */
  side2_volume = ref_iso_volume(triangle0, triangle1, segment0, segment1);
  side0_volume = ref_iso_volume(triangle1, triangle2, segment0, segment1);
  side1_volume = ref_iso_volume(triangle2, triangle0, segment0, segment1);

  total_volume = top_volume - bot_volume;
  if (ref_math_divisible(top_volume, total_volume)) {
    tuvw[0] = top_volume / total_volume;
  } else {
    return REF_DIV_ZERO;
  }

  total_volume = side0_volume + side1_volume + side2_volume;
  if (ref_math_divisible(side0_volume, total_volume) &&
      ref_math_divisible(side1_volume, total_volume) &&
      ref_math_divisible(side2_volume, total_volume)) {
    tuvw[1] = side0_volume / total_volume;
    tuvw[2] = side1_volume / total_volume;
    tuvw[3] = side2_volume / total_volume;
  } else {
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}